

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Function * __thiscall
soul::StructuralParser::parseFunctionDeclaration
          (StructuralParser *this,Context *context,Expression *returnType,Identifier name,
          Context *nameLocation,
          vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          *genericWildcards)

{
  Allocator *pAVar1;
  Scope *pSVar2;
  bool bVar3;
  int iVar4;
  IntrinsicType IVar5;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *this_00;
  pool_ref *this_01;
  UnqualifiedName *target;
  undefined4 extraout_var;
  size_type sVar6;
  VariableDeclaration *o;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *this_02;
  Identifier IVar7;
  Expression *pEVar8;
  Constant *pCVar9;
  Type *this_03;
  Block *o_00;
  string_view s;
  pool_ptr<soul::AST::Function> local_1f8;
  Scope local_1f0;
  char *local_1e8;
  uint32_t local_1dc;
  string_view local_1d8;
  pool_ptr<soul::AST::Constant> local_1c8;
  pool_ptr<soul::AST::Constant> c;
  Property *intrin;
  pool_ref<soul::AST::VariableDeclaration> local_198;
  bool local_189;
  void *local_188;
  Context local_180;
  VariableDeclaration *local_168;
  VariableDeclaration *v;
  CompileMessage local_128;
  Type *local_f0;
  Type *t;
  Expression *type;
  Context typeLocation;
  pool_ref<soul::AST::UnqualifiedName> *w;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *__range2;
  undefined1 local_98 [8];
  ScopedScope scope;
  Function *f;
  CompileMessage local_70;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *local_38;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *genericWildcards_local;
  Context *nameLocation_local;
  Expression *returnType_local;
  Context *context_local;
  StructuralParser *this_local;
  Identifier name_local;
  
  local_38 = genericWildcards;
  genericWildcards_local =
       (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
        *)nameLocation;
  nameLocation_local = (Context *)returnType;
  returnType_local = (Expression *)context;
  context_local = (Context *)this;
  this_local = (StructuralParser *)name.name;
  bVar3 = AST::isResolvedAsType(returnType);
  if ((bVar3) &&
     (iVar4 = (**(code **)&((nameLocation_local->location).sourceCode.object)->isInternal)(),
     iVar4 == 0)) {
    Errors::functionReturnTypeCannotBeConst<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_70);
    CompileMessage::~CompileMessage(&local_70);
  }
  scope.oldScope =
       (Scope *)allocate<soul::AST::Function,soul::AST::Context_const&>
                          (this,(Context *)returnType_local);
  ScopedScope::ScopedScope((ScopedScope *)local_98,this,&((Function *)scope.oldScope)->super_Scope);
  scope.oldScope[7]._vptr_Scope = (_func_int **)this_local;
  AST::Context::operator=((Context *)(scope.oldScope + 8),(Context *)genericWildcards_local);
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
            ((pool_ptr<soul::AST::Expression> *)&__range2,(Expression *)nameLocation_local);
  scope.oldScope[6]._vptr_Scope = (_func_int **)__range2;
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&__range2);
  std::
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ::operator=((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
               *)(scope.oldScope + 0xe),genericWildcards);
  bVar3 = pool_ptr<soul::AST::Expression>::operator!=
                    ((pool_ptr<soul::AST::Expression> *)(scope.oldScope + 6),(void *)0x0);
  if (bVar3) {
    pEVar8 = pool_ptr<soul::AST::Expression>::operator*
                       ((pool_ptr<soul::AST::Expression> *)(scope.oldScope + 6));
    recursivelyReplaceParentScope(pEVar8,scope.oldScope + 5);
  }
  this_00 = (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
             *)(scope.oldScope + 0xe);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ::begin(this_00);
  w = (pool_ref<soul::AST::UnqualifiedName> *)
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::UnqualifiedName>_*,_std::vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>_>
                                     *)&w), bVar3) {
    this_01 = (pool_ref *)
              __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::UnqualifiedName>_*,_std::vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>_>
              ::operator*(&__end2);
    target = pool_ref::operator_cast_to_UnqualifiedName_(this_01);
    recursivelyReplaceParentScope(&target->super_Expression,scope.oldScope + 5);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::UnqualifiedName>_*,_std::vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>_>
    ::operator++(&__end2);
  }
  typeLocation.parentScope = (Scope *)0x571824;
  bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
  while( true ) {
    if (bVar3) {
      parseAnnotation(this,(Annotation *)(scope.oldScope + 0x16));
      c.object = (Constant *)
                 AST::Annotation::findProperty<char[7]>
                           ((Annotation *)(scope.oldScope + 0x16),(char (*) [7])"intrin");
      if (c.object != (Constant *)0x0) {
        pEVar8 = pool_ref<soul::AST::Expression>::operator->
                           ((pool_ref<soul::AST::Expression> *)
                            &((c.object)->super_Expression).super_Statement.super_ASTObject.
                             objectType);
        (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1c8);
        bVar3 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_1c8);
        if (bVar3) {
          pCVar9 = pool_ptr<soul::AST::Constant>::operator->(&local_1c8);
          this_03 = soul::Value::getType(&pCVar9->value);
          bVar3 = Type::isStringLiteral(this_03);
          if (bVar3) {
            pAVar1 = this->allocator;
            pCVar9 = pool_ptr<soul::AST::Constant>::operator->(&local_1c8);
            local_1dc = (uint32_t)soul::Value::getStringLiteral(&pCVar9->value);
            local_1d8 = StringDictionary::getStringForHandle
                                  (&pAVar1->stringDictionary,(Handle)local_1dc);
            s._M_str = local_1d8._M_str;
            s._M_len = (size_t)s._M_str;
            IVar5 = getIntrinsicTypeFromName((soul *)local_1d8._M_len,s);
            *(IntrinsicType *)&scope.oldScope[0x19]._vptr_Scope = IVar5;
            checkAssertion(*(int *)&scope.oldScope[0x19]._vptr_Scope != 0,
                           "f.intrinsic != IntrinsicType::none","parseFunctionDeclaration",0x436);
          }
        }
        pool_ptr<soul::AST::Constant>::~pool_ptr(&local_1c8);
      }
      local_1e8 = ";";
      bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
      if (!bVar3) {
        pool_ptr<soul::AST::Function>::pool_ptr<soul::AST::Function,void>
                  (&local_1f8,(Function *)scope.oldScope);
        o_00 = parseBracedBlock(this,&local_1f8);
        pool_ptr<soul::AST::Block>::pool_ptr<soul::AST::Block,void>
                  ((pool_ptr<soul::AST::Block> *)&local_1f0,o_00);
        scope.oldScope[0x1a]._vptr_Scope = local_1f0._vptr_Scope;
        pool_ptr<soul::AST::Block>::~pool_ptr((pool_ptr<soul::AST::Block> *)&local_1f0);
        pool_ptr<soul::AST::Function>::~pool_ptr(&local_1f8);
      }
      pSVar2 = scope.oldScope;
      ScopedScope::~ScopedScope((ScopedScope *)local_98);
      return (Function *)pSVar2;
    }
    giveErrorOnExternalKeyword(this);
    getContext((Context *)&type,this);
    t = (Type *)parseType(this,functionParameter);
    iVar4 = (*(((Expression *)t)->super_Statement).super_ASTObject._vptr_ASTObject[0xb])();
    local_f0 = (Type *)CONCAT44(extraout_var,iVar4);
    if ((local_f0 != (Type *)0x0) && (bVar3 = Type::isVoid(local_f0), bVar3)) break;
    sVar6 = std::
            vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            ::size((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                    *)(scope.oldScope + 0xb));
    if (0x7f < sVar6) {
      Errors::tooManyParameters<>();
      AST::Context::throwError((Context *)&type,(CompileMessage *)&v,false);
    }
    getContext(&local_180,this);
    local_188 = (void *)0x0;
    local_189 = false;
    o = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                  (this,&local_180,(Expression *)t,&local_188,&local_189);
    AST::Context::~Context(&local_180);
    this_02 = (vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
               *)(scope.oldScope + 0xb);
    local_168 = o;
    pool_ref<soul::AST::VariableDeclaration>::pool_ref<soul::AST::VariableDeclaration,void>
              (&local_198,o);
    std::
    vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
    ::push_back(this_02,&local_198);
    pool_ref<soul::AST::VariableDeclaration>::~pool_ref(&local_198);
    local_168->isFunctionParameter = true;
    IVar7 = parseIdentifier(this);
    (local_168->name).name = IVar7.name;
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
    if (!bVar3) {
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    }
    AST::Context::~Context((Context *)&type);
  }
  Errors::parameterCannotBeVoid<>();
  AST::Context::throwError((Context *)&type,&local_128,false);
}

Assistant:

AST::Function& parseFunctionDeclaration (const AST::Context& context, AST::Expression& returnType,
                                             Identifier name, const AST::Context& nameLocation,
                                             std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards)
    {
        if (AST::isResolvedAsType (returnType) && returnType.getConstness() == AST::Constness::definitelyConst)
            throwError (Errors::functionReturnTypeCannotBeConst());

        auto& f = allocate<AST::Function> (context);
        ScopedScope scope (*this, f);

        f.name = name;
        f.nameLocation = nameLocation;
        f.returnType = returnType;
        f.genericWildcards = std::move (genericWildcards);

        if (f.returnType != nullptr)
            recursivelyReplaceParentScope (*f.returnType, f);

        for (auto& w : f.genericWildcards)
            recursivelyReplaceParentScope (w, f);

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                giveErrorOnExternalKeyword();
                auto typeLocation = getContext();
                auto& type = parseType (ParseTypeContext::functionParameter);

                if (auto t = type.getConcreteType())
                    if (t->isVoid())
                        typeLocation.throwError (Errors::parameterCannotBeVoid());

                if (f.parameters.size() > 127)
                    typeLocation.throwError (Errors::tooManyParameters());

                auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
                f.parameters.push_back (v);
                v.isFunctionParameter = true;
                v.name = parseIdentifier();

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        parseAnnotation (f.annotation);

        if (auto intrin = f.annotation.findProperty ("intrin"))
        {
            if (auto c = intrin->value->getAsConstant())
            {
                if (c->value.getType().isStringLiteral())
                {
                    f.intrinsic = getIntrinsicTypeFromName (allocator.stringDictionary.getStringForHandle (c->value.getStringLiteral()));
                    SOUL_ASSERT (f.intrinsic != IntrinsicType::none);
                }
            }
        }

        if (! matchIf (Operator::semicolon))
            f.block = parseBracedBlock (f);

        return f;
    }